

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

FloatParts float_to_float(FloatParts a,FloatFmt *dstf,float_status *s)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  FloatParts FVar5;
  FloatParts FVar6;
  
  uVar3 = a._8_8_;
  uVar4 = a.frac;
  if (dstf->arm_althp == true) {
    uVar1 = a._12_4_ & 0xff;
    if (uVar1 - 4 < 2) {
      s->float_exception_flags = s->float_exception_flags | 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar3 & 0xffffff0000000000 | 0x100000000;
      return (FloatParts)(auVar2 << 0x40);
    }
    if (uVar1 == 3) {
      s->float_exception_flags = s->float_exception_flags | 1;
      uVar4 = (ulong)(uint)dstf->exp_max | uVar3 & 0xffffff0000000000 | 0x200000000;
      FVar6.frac = ~(-1L << ((byte)dstf->frac_size & 0x3f)) << ((byte)dstf->frac_shift & 0x3f);
      FVar6.exp = (int)uVar4;
      FVar6.cls = (char)(uVar4 >> 0x20);
      FVar6.sign = (_Bool)(char)(uVar4 >> 0x28);
      FVar6._14_2_ = (short)(uVar4 >> 0x30);
      return FVar6;
    }
  }
  else if (float_class_inf < a.cls) {
    if (a.cls == float_class_snan) {
      s->float_exception_flags = s->float_exception_flags | 1;
      uVar3 = uVar3 & 0xffffff00ffffffff | 0x400000000;
      uVar4 = uVar4 | 0x2000000000000000;
    }
    if (s->default_nan_mode != '\0') {
      uVar4 = 0x2000000000000000;
      uVar3 = 0x47fffffff;
    }
  }
  FVar5.exp = (int)uVar3;
  FVar5.cls = (char)(uVar3 >> 0x20);
  FVar5.sign = (_Bool)(char)(uVar3 >> 0x28);
  FVar5._14_2_ = (short)(uVar3 >> 0x30);
  FVar5.frac = uVar4;
  return FVar5;
}

Assistant:

static FloatParts float_to_float(FloatParts a, const FloatFmt *dstf,
                                 float_status *s)
{
    if (dstf->arm_althp) {
        switch (a.cls) {
        case float_class_qnan:
        case float_class_snan:
            /* There is no NaN in the destination format.  Raise Invalid
             * and return a zero with the sign of the input NaN.
             */
            s->float_exception_flags |= float_flag_invalid;
            a.cls = float_class_zero;
            a.frac = 0;
            a.exp = 0;
            break;

        case float_class_inf:
            /* There is no Inf in the destination format.  Raise Invalid
             * and return the maximum normal with the correct sign.
             */
            s->float_exception_flags |= float_flag_invalid;
            a.cls = float_class_normal;
            a.exp = dstf->exp_max;
            a.frac = ((1ull << dstf->frac_size) - 1) << dstf->frac_shift;
            break;

        default:
            break;
        }
    } else if (is_nan(a.cls)) {
        if (is_snan(a.cls)) {
            s->float_exception_flags |= float_flag_invalid;
            a = parts_silence_nan(a, s);
        }
        if (s->default_nan_mode) {
            return parts_default_nan(s);
        }
    }
    return a;
}